

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QDockWidgetGroupLayout::QDockWidgetGroupLayout
          (QDockWidgetGroupLayout *this,QDockWidgetGroupWindow *parent)

{
  QWidgetResizeHandler *this_00;
  
  QLayout::QLayout(&this->super_QLayout,&parent->super_QWidget);
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverSeparator.d.size = 0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverPos.xp = 0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverPos.yp = 0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverSeparator.d.d =
       (Data *)0x0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hoverSeparator.d.ptr =
       (int *)0x0;
  QCursor::QCursor(&(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).oldCursor
                  );
  QCursor::QCursor(&(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).
                    adjustedCursor);
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).hasOldCursor = false;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).cursorAdjusted = false;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparator.d.d =
       (Data *)0x0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparator.d.ptr =
       (int *)0x0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparator.d.size = 0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparatorOrigin.xp =
       0;
  (this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparatorOrigin.yp =
       0;
  *(undefined8 *)
   &(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparatorOrigin.yp
       = 0;
  *(undefined8 *)
   &(this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>).movingSeparatorPos.yp = 0
  ;
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_008035f0;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QDockWidgetGroupLayout_008036f8;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(&this->layoutState);
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(&this->savedState);
  QLayout::setSizeConstraint(&this->super_QLayout,SetMinAndMaxSize);
  this_00 = (QWidgetResizeHandler *)operator_new(0x48);
  QWidgetResizeHandler::QWidgetResizeHandler
            ((QWidgetResizeHandler *)this_00,&parent->super_QWidget,(QWidget *)0x0);
  this->resizer = this_00;
  return;
}

Assistant:

QDockWidgetGroupLayout(QDockWidgetGroupWindow* parent) : QLayout(parent) {
        setSizeConstraint(QLayout::SetMinAndMaxSize);
        resizer = new QWidgetResizeHandler(parent);
    }